

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,decimal_fp<double> *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  basic_appender<char> bVar5;
  byte bVar6;
  int **ppiVar7;
  size_t sVar8;
  int **ppiVar9;
  int iVar10;
  buffer<char> *buf;
  undefined8 uVar11;
  int iVar12;
  undefined8 uVar13;
  char cVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_40_8_fd1bf2f9 write;
  int num_zeros;
  undefined1 local_e6 [2];
  bool local_e4 [4];
  int local_e0;
  undefined1 local_dc [12];
  basic_specs local_d0;
  format_specs local_c8;
  undefined1 local_b8 [20];
  undefined1 auStack_a4 [20];
  format_specs *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  int *local_60;
  int *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_d0 = (basic_specs)f->significand;
  lVar4 = 0x3f;
  if (((ulong)local_d0 | 1) != 0) {
    for (; ((ulong)local_d0 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  iVar17 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar4] -
           (uint)((ulong)local_d0 <
                 (ulong)*(basic_specs *)
                         (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                         (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar4] * 8));
  local_e6[1] = '0';
  local_e0 = iVar17;
  local_dc._0_4_ = s;
  local_c8.super_basic_specs = local_d0;
  if (iVar17 < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/base.h"
                ,0x1b6,"negative value");
  }
  uVar15 = (iVar17 + 1) - (uint)(s == none);
  uVar16 = (ulong)uVar15;
  uVar2 = (specs->super_basic_specs).data_;
  local_e6[0] = '.';
  local_dc._4_8_ = out.container;
  if ((uVar2 >> 0xe & 1) != 0) {
    local_c8.width = s;
    local_e6[0] = decimal_point_impl<char>(loc);
    uVar2 = (specs->super_basic_specs).data_;
    s = local_c8.width;
  }
  uVar13 = auStack_a4._4_8_;
  uVar11 = local_dc._4_8_;
  iVar10 = f->exponent;
  iVar1 = iVar10 + iVar17;
  iVar3 = specs->precision;
  bVar6 = (byte)uVar2 & 7;
  if (bVar6 == 1) goto LAB_001de132;
  if ((uVar2 & 7) != 2) {
    if (iVar1 < -3) {
LAB_001de132:
      iVar10 = iVar10 + iVar17 + -1;
      if ((uVar2 >> 0xd & 1) == 0) {
        iVar12 = 0;
        if (iVar17 == 1) {
          local_e6[0] = '\0';
          iVar12 = 0;
        }
      }
      else {
        iVar12 = 0;
        if (0 < iVar3 - iVar17) {
          iVar12 = iVar3 - iVar17;
        }
        uVar16 = (ulong)(uVar15 + iVar12);
      }
      iVar3 = 1 - iVar1;
      if (0 < iVar1) {
        iVar3 = iVar10;
      }
      lVar4 = 2;
      if (99 < iVar3) {
        lVar4 = (ulong)(999 < iVar3) + 3;
      }
      sVar8 = (3 - (ulong)(local_e6[0] == '\0')) + uVar16 + lVar4;
      local_b8._0_4_ = s;
      auStack_a4[0] = local_e6[0];
      local_b8._16_4_ = iVar17;
      auStack_a4._4_5_ = CONCAT14('0',iVar12);
      auStack_a4._10_2_ = SUB82(uVar13,6);
      auStack_a4._4_8_ =
           CONCAT26(auStack_a4._10_2_,CONCAT15(((uVar2 >> 0xc & 1) == 0) << 5,auStack_a4._4_5_)) |
           0x450000000000;
      auStack_a4._12_4_ = iVar10;
      local_b8._8_8_ = local_d0;
      if (specs->width < 1) {
        uVar16 = sVar8 + *(size_t *)(local_dc._4_8_ + 8);
        local_d0 = (basic_specs)f;
        if (*(size_t *)(local_dc._4_8_ + 0x10) < uVar16) {
          local_d0 = (basic_specs)f;
          (**(grow_fun *)(local_dc._4_8_ + 0x18))((buffer<char> *)local_dc._4_8_,uVar16);
        }
        bVar5 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<double>,_fmt::v11::detail::digit_grouping<char>_>
                ::anon_class_40_8_fd1bf2f9::operator()
                          ((anon_class_40_8_fd1bf2f9 *)local_b8,(iterator)uVar11);
      }
      else {
        local_d0 = (basic_specs)f;
        bVar5 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                          ((basic_appender<char>)local_dc._4_8_,specs,sVar8,sVar8,
                           (anon_class_40_8_fd1bf2f9 *)local_b8);
      }
      return (basic_appender<char>)bVar5.container;
    }
    if (0 < iVar3) {
      exp_upper = iVar3;
    }
    if (exp_upper < iVar1) goto LAB_001de132;
  }
  local_c8.precision = iVar1;
  if (-1 < iVar10) {
    uVar16 = (ulong)(iVar10 + uVar15);
    local_e4 = (bool  [4])(iVar3 - iVar1);
    if ((uVar2 >> 0xd & 1) != 0) {
      uVar16 = uVar16 + 1;
      if (((int)local_e4 < 1) && (bVar6 != 2)) {
        local_e4[0] = false;
        local_e4[1] = false;
        local_e4[2] = false;
        local_e4[3] = false;
      }
      else if (0 < (int)local_e4) {
        uVar16 = uVar16 + (uint)local_e4;
      }
    }
    local_d0 = (basic_specs)f;
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar2 >> 0xe) & 1));
    iVar17 = 0;
    if (local_48 != (digit_grouping<char> *)0x0) {
      ppiVar9 = (int **)(local_70._8_8_ + local_70._M_allocated_capacity);
      lVar4 = 0;
      uVar11 = local_70._0_8_;
      do {
        if ((int **)uVar11 == ppiVar9) {
          cVar14 = *(char *)((long)ppiVar9 + -1);
          uVar11 = ppiVar9;
        }
        else {
          cVar14 = *(char *)uVar11;
          if ((byte)(cVar14 + 0x81U) < 0x82) goto LAB_001de33c;
          uVar11 = (int **)(uVar11 + 1);
        }
        iVar17 = iVar17 + cVar14;
        if (iVar1 <= iVar17) goto LAB_001de33c;
        lVar4 = lVar4 + 1;
      } while( true );
    }
    lVar4 = 0;
LAB_001de33c:
    local_b8._0_8_ = local_dc;
    local_b8._8_8_ = &local_c8;
    unique0x00004e80 = &local_e0;
    auStack_a4._4_4_ = local_d0.data_;
    auStack_a4[8] = local_d0.fill_data_[0];
    auStack_a4[9] = local_d0.fill_data_[1];
    auStack_a4[10] = local_d0.fill_data_[2];
    auStack_a4[0xb] = local_d0.fill_data_[3];
    local_88._M_allocated_capacity = (size_type)local_e6;
    local_88._8_8_ = local_e4;
    local_78 = local_e6 + 1;
    auStack_a4._12_8_ = &local_70;
    local_90 = specs;
    bVar5 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_&>
                      ((basic_appender<char>)local_dc._4_8_,specs,uVar16 + lVar4,uVar16 + lVar4,
                       (anon_class_72_9_eb40e20e *)local_b8);
    if (local_50 != &local_40) {
      operator_delete(local_50,(ulong)(local_40._M_allocated_capacity + 1));
    }
    uVar11 = local_60;
    uVar13 = local_70._0_8_;
    if ((int **)local_70._0_8_ == &local_60) {
      return (basic_appender<char>)bVar5.container;
    }
LAB_001de509:
    operator_delete((void *)uVar13,uVar11 + 1);
    return (basic_appender<char>)bVar5.container;
  }
  if (0 < iVar1) {
    iVar10 = 0;
    local_e4 = (bool  [4])(iVar3 - iVar17 & (int)(uVar2 << 0x12) >> 0x1f);
    uVar15 = (uint)local_e4;
    if ((int)local_e4 < 1) {
      uVar15 = 0;
    }
    local_d0 = (basic_specs)f;
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)local_b8,loc,(bool)((byte)(uVar2 >> 0xe) & 1));
    if (local_90 != (format_specs *)0x0) {
      ppiVar7 = (int **)(local_b8._0_8_ + (long)(basic_specs *)local_b8._8_8_);
      lVar4 = 0;
      ppiVar9 = (int **)local_b8._0_8_;
      do {
        if (ppiVar9 == ppiVar7) {
          cVar14 = *(char *)((long)ppiVar7 + -1);
          ppiVar9 = ppiVar7;
        }
        else {
          cVar14 = *(char *)ppiVar9;
          if ((byte)(cVar14 + 0x81U) < 0x82) goto LAB_001de478;
          ppiVar9 = (int **)((long)ppiVar9 + 1);
        }
        iVar10 = iVar10 + cVar14;
        if (iVar1 <= iVar10) goto LAB_001de478;
        lVar4 = lVar4 + 1;
      } while( true );
    }
    lVar4 = 0;
LAB_001de478:
    sVar8 = uVar15 + uVar16 + lVar4 + 1;
    local_70._M_allocated_capacity = (size_type)local_dc;
    local_70._8_8_ = &local_c8;
    local_60 = &local_e0;
    local_58 = &local_c8.precision;
    local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_e6;
    local_40._M_allocated_capacity = (size_type)local_e4;
    local_40._8_8_ = local_e6 + 1;
    local_48 = (digit_grouping<char> *)local_b8;
    bVar5 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_&>
                      ((basic_appender<char>)local_dc._4_8_,specs,sVar8,sVar8,
                       (anon_class_64_8_085c650e *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_a4._12_8_ != &local_88) {
      operator_delete((void *)auStack_a4._12_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    uVar11 = stack0xffffffffffffff58;
    uVar13 = local_b8._0_8_;
    if ((undefined1 *)local_b8._0_8_ == local_b8 + 0x10) {
      return (basic_appender<char>)bVar5.container;
    }
    goto LAB_001de509;
  }
  iVar10 = -iVar1;
  local_70._M_allocated_capacity._0_4_ = iVar10;
  if (iVar17 == 0) {
    if ((-1 < iVar3) && (SBORROW4(iVar3,iVar10) != iVar3 + iVar1 < 0)) {
      local_70._M_allocated_capacity._0_4_ = iVar3;
      iVar10 = iVar3;
    }
    if (iVar10 == 0) {
      local_e4[0] = (bool)(char)((uVar2 & 0x2000) >> 0xd);
      iVar17 = 2 - (uint)((uVar2 & 0x2000) == 0);
      iVar10 = 0;
      goto LAB_001de412;
    }
  }
  local_e4[0] = true;
  iVar17 = 2;
LAB_001de412:
  sVar8 = (uint)(iVar17 + iVar10) + uVar16;
  local_b8._0_8_ = local_dc;
  local_b8._8_8_ = local_e4;
  unique0x00004e80 = local_e6;
  auStack_a4._4_8_ = &local_70;
  auStack_a4._12_8_ = local_e6 + 1;
  local_90 = &local_c8;
  local_88._M_allocated_capacity = (size_type)&local_e0;
  local_d0 = (basic_specs)f;
  bVar5 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_&>
                    ((basic_appender<char>)local_dc._4_8_,specs,sVar8,sVar8,
                     (anon_class_56_7_88befd79 *)local_b8);
  return (basic_appender<char>)bVar5.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    int exp_upper, locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}